

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

string * formatString<char_const*,int,int>(char *fmt,char *args,int args_1,int args_2)

{
  int iVar1;
  pointer __s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uint in_ECX;
  undefined8 in_RDX;
  char *in_RSI;
  string *in_RDI;
  uint in_R8D;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  size_t size;
  char *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar2;
  char *__end;
  string *__beg;
  allocator<char> local_31;
  char local_30 [8];
  ulong local_28;
  uint local_20;
  uint local_1c;
  undefined8 local_18;
  char *local_10;
  
  uVar2 = 0;
  __beg = in_RDI;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = snprintf((char *)0x0,0,in_RSI,in_RDX,(ulong)in_ECX,(ulong)in_R8D);
  local_28 = (ulong)(iVar1 + 1);
  operator_new__(local_28);
  __end = local_30;
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RDI,in_stack_ffffffffffffff78);
  __s = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RDI);
  snprintf(__s,local_28,local_10,local_18,(ulong)local_1c,(ulong)local_20);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                   ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RDI);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>
            (this,(char *)__beg,__end,(allocator<char> *)CONCAT17(uVar2,in_stack_ffffffffffffff88));
  std::allocator<char>::~allocator(&local_31);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RDI);
  return in_RDI;
}

Assistant:

std::string formatString(const char* fmt, Args... args) {
    // Determine required size (+1 for '\0')
    size_t size = snprintf(nullptr, 0, fmt, args...) + 1;
    // Allocate necessary buffer
    std::unique_ptr<char[]> buffer(new char[size]);

    // Write string format to buffer
    snprintf(buffer.get(), size, fmt, args...);
    return std::string(buffer.get(), buffer.get() + size - 1);
}